

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::updateDualDevexWeights(HEkk *this,HVector *column,double new_pivotal_edge_weight)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  double *pdVar6;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double aa_iRow;
  HighsInt iRow;
  HighsInt iEntry;
  bool use_row_indices;
  HighsInt to_entry;
  double *column_array;
  HighsInt *variable_index;
  HighsInt column_count;
  HighsInt num_row;
  int local_60;
  HighsSimplexAnalysis *in_stack_ffffffffffffffb0;
  int local_3c;
  int local_34;
  double *local_30;
  int *local_28;
  HighsInt local_20;
  uint local_1c;
  double local_18;
  long local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  local_1c = *(uint *)(in_RDI + 0x219c);
  local_20 = *(HighsInt *)(local_10 + 4);
  local_28 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x771fb7);
  local_30 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x771fca);
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20));
  if ((int)sVar4 < (int)local_1c) {
    uVar2 = *(uint *)(in_RDI + 0x3860);
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20));
    printf("HEkk::updateDualDevexWeights solve %d: dual_edge_weight_.size() = %d < %d\n",
           (ulong)uVar2,sVar4 & 0xffffffff,(ulong)local_1c);
    fflush(_stdout);
  }
  bVar3 = HSimplexNla::sparseLoopStyle((HSimplexNla *)(in_RDI + 0x2b38),local_20,local_1c,&local_34)
  ;
  for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
    if (bVar3) {
      local_60 = local_28[local_3c];
    }
    else {
      local_60 = local_3c;
    }
    dVar1 = local_30[local_60];
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20),(long)local_60)
    ;
    in_stack_ffffffffffffffb0 = (HighsSimplexAnalysis *)(local_18 * dVar1 * dVar1);
    pdVar6 = std::max<double>(pvVar5,(double *)&stack0xffffffffffffffb0);
    dVar1 = *pdVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20),(long)local_60)
    ;
    *pvVar5 = dVar1;
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  return;
}

Assistant:

void HEkk::updateDualDevexWeights(const HVector* column,
                                  const double new_pivotal_edge_weight) {
  analysis_.simplexTimerStart(DevexUpdateWeightClock);

  const HighsInt num_row = lp_.num_row_;
  const HighsInt column_count = column->count;
  const HighsInt* variable_index = column->index.data();
  const double* column_array = column->array.data();

  if ((HighsInt)dual_edge_weight_.size() < num_row) {
    printf(
        "HEkk::updateDualDevexWeights solve %d: "
        "dual_edge_weight_.size() = %d < %d\n",
        (int)debug_solve_call_num_, (int)dual_edge_weight_.size(),
        (int)num_row);
    fflush(stdout);
  }
  assert((HighsInt)dual_edge_weight_.size() >= num_row);
  HighsInt to_entry;
  const bool use_row_indices =
      simplex_nla_.sparseLoopStyle(column_count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? variable_index[iEntry] : iEntry;
    const double aa_iRow = column_array[iRow];
    dual_edge_weight_[iRow] = max(dual_edge_weight_[iRow],
                                  new_pivotal_edge_weight * aa_iRow * aa_iRow);
  }
  analysis_.simplexTimerStop(DevexUpdateWeightClock);
}